

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markable.hpp
# Opt level: O1

void __thiscall
ak_toolkit::markable_ns::dual_storage<mark_range2>::operator=
          (dual_storage<mark_range2> *this,dual_storage<mark_range2> *rhs)

{
  int iVar1;
  int iVar2;
  union_type uVar3;
  
  iVar1 = (this->value_)._value.super_range2_members.min_;
  iVar2 = (this->value_)._value.super_range2_members.max_;
  if (iVar1 <= iVar2) {
    if ((rhs->value_)._value.super_range2_members.min_ <=
        (rhs->value_)._value.super_range2_members.max_) {
      uVar3._value.super_range2_members = *(value_type *)&rhs->value_;
LAB_0010732e:
      this->value_ = uVar3;
      return;
    }
    if (iVar1 <= iVar2) {
      if ((rhs->value_)._value.super_range2_members.max_ <
          (rhs->value_)._value.super_range2_members.min_) {
        range2::~range2((range2 *)this);
        uVar3 = (union_type)0xffffffff00000000;
        goto LAB_0010732e;
      }
      if (iVar1 <= iVar2) {
        return;
      }
    }
  }
  if ((rhs->value_)._value.super_range2_members.max_ <
      (rhs->value_)._value.super_range2_members.min_) {
    return;
  }
  range2::range2((range2 *)this,(range2 *)rhs);
  return;
}

Assistant:

void operator=(dual_storage&& rhs) // TODO: add noexcept
    {
      if (has_value() && rhs.has_value())
      {
        as_value() = std::move(rhs.as_value());
      }
      else if (has_value() && !rhs.has_value())
      {
        clear_value();
      }
      else if (!has_value() && rhs.has_value())
      {
        change_to_value(std::move(rhs.as_value()));
      }
    }